

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontTable.cpp
# Opt level: O3

void __thiscall FontTable::writeSettings(FontTable *this,QSettings *settings)

{
  long lVar1;
  undefined1 *puVar2;
  QString local_68;
  QVariant local_50;
  
  QSettings::beginGroup((QString *)settings);
  puVar2 = FontTableTU::FontKeys;
  lVar1 = 0;
  do {
    QFont::toString();
    QVariant::QVariant(&local_50,&local_68);
    QSettings::setValue((QString *)settings,(QVariant *)puVar2);
    QVariant::~QVariant(&local_50);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
      }
    }
    puVar2 = &(((QVariant *)puVar2)->d).field_0x18;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x30);
  QSettings::endGroup();
  return;
}

Assistant:

void FontTable::writeSettings(QSettings &settings) const {

    settings.beginGroup(Keys::Fonts);

    for (int i = 0; i < Count; ++i) {
        settings.setValue(TU::FontKeys[i], mFonts[i].toString());
    }

    settings.endGroup();
}